

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_early_data_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL3_STATE *pSVar1;
  int iVar2;
  bool bVar3;
  
  pSVar1 = hs->ssl->s3;
  if ((pSVar1->field_0xdd & 0x10) == 0) {
    bVar3 = true;
    if ((hs->field_0x6c9 & 8) != 0) {
      iVar2 = CBB_add_u16(out_compressible,0x2a);
      bVar3 = false;
      if (iVar2 != 0) {
        iVar2 = CBB_add_u16(out_compressible,0);
        bVar3 = false;
        if (iVar2 != 0) {
          iVar2 = CBB_flush(out_compressible);
          bVar3 = iVar2 != 0;
        }
      }
    }
  }
  else {
    bVar3 = true;
    if (pSVar1->early_data_reason == ssl_early_data_unknown) {
      __assert_fail("ssl->s3->early_data_reason != ssl_early_data_unknown",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x838,
                    "bool bssl::ext_early_data_add_clienthello(const SSL_HANDSHAKE *, CBB *, CBB *, ssl_client_hello_type_t)"
                   );
    }
  }
  return bVar3;
}

Assistant:

static bool ext_early_data_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                           CBB *out_compressible,
                                           ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // The second ClientHello never offers early data, and we must have already
  // filled in |early_data_reason| by this point.
  if (ssl->s3->used_hello_retry_request) {
    assert(ssl->s3->early_data_reason != ssl_early_data_unknown);
    return true;
  }

  if (!hs->early_data_offered) {
    return true;
  }

  // If offering ECH, the extension only applies to ClientHelloInner, but we
  // send the extension in both ClientHellos. This ensures that, if the server
  // handshakes with ClientHelloOuter, it can skip past early data. See
  // draft-ietf-tls-esni-13, section 6.1.
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_early_data) ||  //
      !CBB_add_u16(out_compressible, 0) ||                       //
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}